

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

int __thiscall fmt::internal::ArgMap<char>::init(ArgMap<char> *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  Type TVar3;
  undefined7 extraout_var;
  uint i_2;
  Type arg_type_1;
  uint i_1;
  Type arg_type;
  uint i;
  bool use_values;
  NamedArg *named_arg;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
  *in_stack_ffffffffffffff30;
  uint local_9c;
  pair<fmt::BasicStringRef<char>,_fmt::internal::Arg> local_98;
  Type local_60;
  uint local_5c;
  pair<fmt::BasicStringRef<char>,_fmt::internal::Arg> local_58;
  Type local_24;
  uint local_20;
  undefined1 local_19;
  NamedArg<char> *local_18;
  ArgList *local_10;
  ArgMap<char> *local_8;
  int iVar2;
  
  local_10 = (ArgList *)ctx;
  local_8 = this;
  bVar1 = std::
          vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
          ::empty(in_stack_ffffffffffffff30);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    local_18 = (NamedArg<char> *)0x0;
    TVar3 = ArgList::type(local_10,0xf);
    local_19 = TVar3 == NONE;
    if ((bool)local_19) {
      local_20 = 0;
      while (TVar3 = ArgList::type(local_10,local_20), TVar3 != NONE) {
        local_24 = TVar3;
        if (TVar3 == NAMED_ARG) {
          local_18 = (NamedArg<char> *)(local_10->field_1).values_[local_20].field_0.pointer;
          std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>::
          pair<const_fmt::internal::NamedArg<char>_&,_true>
                    (&local_58,(BasicStringRef<char> *)&(local_18->super_Arg).field_0x18,local_18);
          std::
          vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
          ::push_back(&this->map_,(value_type *)CONCAT44(TVar3,in_stack_ffffffffffffff18));
        }
        local_20 = local_20 + 1;
      }
      iVar2 = 0;
    }
    else {
      for (local_5c = 0; local_5c != 0x10; local_5c = local_5c + 1) {
        local_60 = ArgList::type(local_10,local_5c);
        if (local_60 == NAMED_ARG) {
          local_18 = (NamedArg<char> *)
                     (local_10->field_1).values_[(ulong)local_5c * 2].field_0.pointer;
          std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>::
          pair<const_fmt::internal::NamedArg<char>_&,_true>
                    (&local_98,(BasicStringRef<char> *)&(local_18->super_Arg).field_0x18,local_18);
          std::
          vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
          ::push_back(&this->map_,
                      (value_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        }
      }
      local_9c = 0x10;
      while (TVar3 = (local_10->field_1).args_[local_9c].type, TVar3 != NONE) {
        if (TVar3 == NAMED_ARG) {
          local_18 = (NamedArg<char> *)
                     (local_10->field_1).values_[(ulong)local_9c * 2].field_0.pointer;
          std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>::
          pair<const_fmt::internal::NamedArg<char>_&,_true>
                    ((pair<fmt::BasicStringRef<char>,_fmt::internal::Arg> *)&stack0xffffffffffffff28
                     ,(BasicStringRef<char> *)&(local_18->super_Arg).field_0x18,local_18);
          std::
          vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
          ::push_back(&this->map_,(value_type *)CONCAT44(in_stack_ffffffffffffff1c,TVar3));
        }
        local_9c = local_9c + 1;
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

void fmt::internal::ArgMap<Char>::init(const ArgList &args) {
  if (!map_.empty())
    return;
  typedef internal::NamedArg<Char> NamedArg;
  const NamedArg *named_arg = 0;
  bool use_values =
      args.type(ArgList::MAX_PACKED_ARGS - 1) == internal::Arg::NONE;
  if (use_values) {
    for (unsigned i = 0;/*nothing*/; ++i) {
      internal::Arg::Type arg_type = args.type(i);
      switch (arg_type) {
      case internal::Arg::NONE:
        return;
      case internal::Arg::NAMED_ARG:
        named_arg = static_cast<const NamedArg*>(args.values_[i].pointer);
        map_.push_back(Pair(named_arg->name, *named_arg));
        break;
      default:
        /*nothing*/;
      }
    }
    return;
  }
  for (unsigned i = 0; i != ArgList::MAX_PACKED_ARGS; ++i) {
    internal::Arg::Type arg_type = args.type(i);
    if (arg_type == internal::Arg::NAMED_ARG) {
      named_arg = static_cast<const NamedArg*>(args.args_[i].pointer);
      map_.push_back(Pair(named_arg->name, *named_arg));
    }
  }
  for (unsigned i = ArgList::MAX_PACKED_ARGS;/*nothing*/; ++i) {
    switch (args.args_[i].type) {
    case internal::Arg::NONE:
      return;
    case internal::Arg::NAMED_ARG:
      named_arg = static_cast<const NamedArg*>(args.args_[i].pointer);
      map_.push_back(Pair(named_arg->name, *named_arg));
      break;
    default:
      /*nothing*/;
    }
  }
}